

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  void *pvVar1;
  bool local_101;
  MutexLock local_f8;
  MutexLock l;
  InternalKey local_d0;
  undefined1 local_b0 [8];
  ManualCompaction manual;
  undefined1 local_68 [8];
  InternalKey end_storage;
  InternalKey begin_storage;
  Slice *end_local;
  Slice *begin_local;
  int level_local;
  DBImpl *this_local;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x247,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (6 < level + 1) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x248,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  InternalKey::InternalKey((InternalKey *)&end_storage.field_0x18);
  InternalKey::InternalKey((InternalKey *)local_68);
  ManualCompaction::ManualCompaction((ManualCompaction *)local_b0);
  local_b0[4] = false;
  local_b0._0_4_ = level;
  if (begin == (Slice *)0x0) {
    manual.level = 0;
    manual.done = false;
    manual._5_3_ = 0;
  }
  else {
    InternalKey::InternalKey(&local_d0,begin,0xffffffffffffff,kTypeValue);
    InternalKey::operator=((InternalKey *)&end_storage.field_0x18,&local_d0);
    InternalKey::~InternalKey(&local_d0);
    manual._0_8_ = &end_storage.field_0x18;
  }
  if (end == (Slice *)0x0) {
    manual.begin = (InternalKey *)0x0;
  }
  else {
    InternalKey::InternalKey((InternalKey *)&l,end,0,kTypeDeletion);
    InternalKey::operator=((InternalKey *)local_68,(InternalKey *)&l);
    InternalKey::~InternalKey((InternalKey *)&l);
    manual.begin = (InternalKey *)local_68;
  }
  MutexLock::MutexLock(&local_f8,&this->mutex_);
  while( true ) {
    local_101 = false;
    if ((local_b0[4] & 1U) == 0) {
      pvVar1 = port::AtomicPointer::Acquire_Load(&this->shutting_down_);
      local_101 = false;
      if (pvVar1 == (void *)0x0) {
        local_101 = Status::ok(&this->bg_error_);
      }
    }
    if (local_101 == false) break;
    if (this->manual_compaction_ == (ManualCompaction *)0x0) {
      this->manual_compaction_ = (ManualCompaction *)local_b0;
      MaybeScheduleCompaction(this);
    }
    else {
      port::CondVar::Wait(&this->bg_cv_);
    }
  }
  if (this->manual_compaction_ == (ManualCompaction *)local_b0) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  MutexLock::~MutexLock(&local_f8);
  ManualCompaction::~ManualCompaction((ManualCompaction *)local_b0);
  InternalKey::~InternalKey((InternalKey *)local_68);
  InternalKey::~InternalKey((InternalKey *)&end_storage.field_0x18);
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice *begin, const Slice *end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin==NULL) {
    manual.begin = NULL;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end==NULL) {
    manual.end = NULL;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.Acquire_Load() && bg_error_.ok()) {
    if (manual_compaction_==NULL) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      bg_cv_.Wait();
    }
  }
  if (manual_compaction_==&manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = NULL;
  }
}